

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void av1_loop_restoration_filter_frame
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int optimized_lr,void *lr_ctxt)

{
  int iVar1;
  AV1LrStruct *in_RCX;
  AV1_COMMON *in_RSI;
  AV1LrStruct *loop_rest_ctxt;
  int num_planes;
  int in_stack_00000048;
  int in_stack_0000004c;
  AV1_COMMON *in_stack_00000050;
  YV12_BUFFER_CONFIG *in_stack_00000058;
  AV1LrStruct *in_stack_00000060;
  int num_planes_00;
  undefined4 in_stack_ffffffffffffffd8;
  AV1LrStruct *lr_ctxt_00;
  
  iVar1 = av1_num_planes(in_RSI);
  lr_ctxt_00 = in_RCX;
  av1_loop_restoration_filter_frame_init
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_0000004c,
             in_stack_00000048);
  num_planes_00 = (int)((ulong)in_RCX >> 0x20);
  foreach_rest_unit_in_planes
            (lr_ctxt_00,(AV1_COMMON *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),num_planes_00);
  loop_restoration_copy_planes
            (lr_ctxt_00,(AV1_COMMON *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),num_planes_00);
  return;
}

Assistant:

void av1_loop_restoration_filter_frame(YV12_BUFFER_CONFIG *frame,
                                       AV1_COMMON *cm, int optimized_lr,
                                       void *lr_ctxt) {
  assert(!cm->features.all_lossless);
  const int num_planes = av1_num_planes(cm);

  AV1LrStruct *loop_rest_ctxt = (AV1LrStruct *)lr_ctxt;

  av1_loop_restoration_filter_frame_init(loop_rest_ctxt, frame, cm,
                                         optimized_lr, num_planes);

  foreach_rest_unit_in_planes(loop_rest_ctxt, cm, num_planes);

  loop_restoration_copy_planes(loop_rest_ctxt, cm, num_planes);
}